

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

void __thiscall
kiste::parse_context::parse_context
          (parse_context *this,istream *is,ostream *os,string *filename,bool report_exceptions,
          bool line_directives)

{
  this->_is = is;
  this->_os = os;
  std::__cxx11::string::string((string *)&this->_filename,(string *)filename);
  this->_report_exceptions = report_exceptions;
  this->_line_directives = line_directives;
  (this->_line)._M_dataplus._M_p = (pointer)&(this->_line).field_2;
  (this->_line)._M_string_length = 0;
  (this->_line).field_2._M_local_buf[0] = '\0';
  this->_line_no = 0;
  this->_curly_level = 0;
  *(undefined8 *)((long)&this->_curly_level + 1) = 0;
  *(undefined8 *)((long)&this->_class_curly_level + 1) = 0;
  return;
}

Assistant:

parse_context(std::istream& is,
                  std::ostream& os,
                  const std::string& filename,
                  bool report_exceptions,
                  bool line_directives)
        : _is(is),
          _os(os),
          _filename{filename},
          _report_exceptions{report_exceptions},
          _line_directives{line_directives}
    {
    }